

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
               uint8_t maxThreshold)

{
  uint uVar1;
  uint uVar2;
  imageException *this;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src_00);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if (minThreshold <= maxThreshold) {
    uVar1 = out->_rowSize;
    if (height * uVar1 != 0) {
      puVar4 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
      puVar3 = puVar4 + height * uVar1;
      uVar2 = in->_rowSize;
      puVar5 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2);
      do {
        if ((ulong)width != 0) {
          uVar6 = 0;
          do {
            puVar4[uVar6] = -(puVar5[uVar6] <= maxThreshold && minThreshold <= puVar5[uVar6]);
            uVar6 = uVar6 + 1;
          } while (width != uVar6);
        }
        puVar4 = puVar4 + uVar1;
        puVar5 = puVar5 + uVar2;
      } while (puVar4 != puVar3);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this,"Minimum threshold value is bigger than maximum threshold value");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );
        OptimiseRoi( width, height, in, out );

        if( minThreshold > maxThreshold )
            throw imageException( "Minimum threshold value is bigger than maximum threshold value" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
        }
    }